

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2OrderParameter.cpp
# Opt level: O1

void __thiscall
OpenMD::P2OrderParameter::P2OrderParameter
          (P2OrderParameter *this,SimInfo *info,string *filename,string *sele1,int seleOffset)

{
  pointer pcVar1;
  long *plVar2;
  long *plVar3;
  long *local_70;
  long local_60;
  long lStack_58;
  string local_50;
  
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,1);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser = (_func_int **)&PTR__P2OrderParameter_0033af18;
  this->doVect_ = false;
  this->doOffset_ = true;
  (this->selectionScript1_)._M_dataplus._M_p = (pointer)&(this->selectionScript1_).field_2;
  pcVar1 = (sele1->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->selectionScript1_,pcVar1,pcVar1 + sele1->_M_string_length);
  (this->selectionScript2_)._M_dataplus._M_p = (pointer)&(this->selectionScript2_).field_2;
  (this->selectionScript2_)._M_string_length = 0;
  (this->selectionScript2_).field_2._M_local_buf[0] = '\0';
  SelectionManager::SelectionManager(&this->seleMan1_,info);
  SelectionManager::SelectionManager(&this->seleMan2_,info);
  SelectionEvaluator::SelectionEvaluator(&this->evaluator1_,info);
  SelectionEvaluator::SelectionEvaluator(&this->evaluator2_,info);
  this->seleOffset_ = seleOffset;
  (this->orderParams_).
  super__Vector_base<OpenMD::P2OrderParameter::OrderParam,_std::allocator<OpenMD::P2OrderParameter::OrderParam>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->orderParams_).
  super__Vector_base<OpenMD::P2OrderParameter::OrderParam,_std::allocator<OpenMD::P2OrderParameter::OrderParam>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->orderParams_).
  super__Vector_base<OpenMD::P2OrderParameter::OrderParam,_std::allocator<OpenMD::P2OrderParameter::OrderParam>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getPrefix(&local_50,filename);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_60 = *plVar3;
    lStack_58 = plVar2[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar3;
    local_70 = (long *)*plVar2;
  }
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  SelectionEvaluator::loadScriptString(&this->evaluator1_,sele1);
  return;
}

Assistant:

P2OrderParameter::P2OrderParameter(SimInfo* info, const string& filename,
                                     const string& sele1, int seleOffset) :
      StaticAnalyser(info, filename, 1),
      doVect_(false), doOffset_(true), selectionScript1_(sele1),
      seleMan1_(info), seleMan2_(info), evaluator1_(info), evaluator2_(info),
      seleOffset_(seleOffset) {
    setOutputName(getPrefix(filename) + ".p2");

    evaluator1_.loadScriptString(sele1);
  }